

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerCPP::argument_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerCPP *this,Parameter *arg)

{
  SPIRType *type;
  SPIRVariable *pSVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  char (*in_stack_ffffffffffffff38) [2];
  string base;
  string variable_name;
  string local_70;
  string local_50;
  
  type = Compiler::expression_type((Compiler *)this,(arg->id).id);
  local_50._M_dataplus._M_p = "";
  if (arg->write_count == 0) {
    local_50._M_dataplus._M_p = "const ";
  }
  if (type->pointer == false) {
    local_50._M_dataplus._M_p = "const ";
  }
  pSVar1 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,(arg->id).id);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&base,this,type,0);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
            (&variable_name,this,(ulong)(pSVar1->super_IVariant).self.id,1);
  Compiler::remap_variable_type_name((Compiler *)this,type,&variable_name,&base);
  for (uVar2 = 0; uVar2 < (type->array).super_VectorView<unsigned_int>.buffer_size;
      uVar2 = (ulong)((uint32_t)uVar2 + 1)) {
    CompilerGLSL::to_array_size_abi_cxx11_(&local_70,&this->super_CompilerGLSL,type,(uint32_t)uVar2)
    ;
    in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x29590a;
    join<char_const(&)[12],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
              (&local_50,(spirv_cross *)"std::array<",(char (*) [12])&base,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x294843,
               (char (*) [3])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x29590a,
               in_stack_ffffffffffffff38);
    ::std::__cxx11::string::operator=((string *)&base,(string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  join<char_const*,std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&>
            (__return_storage_ptr__,(spirv_cross *)&local_50,(char **)&base,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2940ab,
             (char (*) [3])&variable_name,in_R9);
  ::std::__cxx11::string::~string((string *)&variable_name);
  ::std::__cxx11::string::~string((string *)&base);
  return __return_storage_ptr__;
}

Assistant:

string CompilerCPP::argument_decl(const SPIRFunction::Parameter &arg)
{
	auto &type = expression_type(arg.id);
	bool constref = !type.pointer || arg.write_count == 0;

	auto &var = get<SPIRVariable>(arg.id);

	string base = type_to_glsl(type);
	string variable_name = to_name(var.self);
	remap_variable_type_name(type, variable_name, base);

	for (uint32_t i = 0; i < type.array.size(); i++)
		base = join("std::array<", base, ", ", to_array_size(type, i), ">");

	return join(constref ? "const " : "", base, " &", variable_name);
}